

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVRAII.cxx
# Opt level: O1

int testUVRAII(int param_1,char **param_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  uv_async_s *puVar3;
  uv_pipe_s *puVar4;
  uv_stream_s *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  long lVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  uint uVar10;
  uv_async_ptr signal;
  uv_async_ptr signalTmp;
  uv_loop_t Loop;
  uv_handle_ptr_base_<uv_handle_s> local_498;
  undefined1 local_488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_480;
  uv_handle_ptr_base_<uv_timer_s> local_478;
  uv_handle_ptr_base_<uv_tty_s> local_468;
  uv_handle_ptr_base_<uv_process_s> local_458;
  uv_handle_ptr_base_<uv_pipe_s> local_448;
  uv_handle_ptr_base_<uv_async_s> local_438;
  uv_handle_ptr_base_<uv_signal_s> local_428;
  uv_handle_ptr_base_<uv_handle_s> local_418;
  uv_handle_ptr_base_<uv_async_s> local_408;
  uv_handle_ptr_base_<uv_timer_s> local_3f8;
  uv_handle_ptr_base_<uv_tty_s> local_3e8;
  uv_handle_ptr_base_<uv_process_s> local_3d8;
  uv_handle_ptr_base_<uv_pipe_s> local_3c8;
  uv_handle_ptr_base_<uv_async_s> local_3b8;
  uv_handle_ptr_base_<uv_signal_s> local_3a8;
  uv_handle_ptr_base_<uv_handle_s> local_398;
  undefined1 local_388 [16];
  uv_handle_ptr_base_<uv_timer_s> local_378;
  anon_union_16_2_bf76bca6_for_active_reqs local_368;
  uv_handle_ptr_base_<uv_process_s> local_358;
  uv_handle_ptr_base_<uv_pipe_s> local_348;
  uv_handle_ptr_base_<uv_async_s> local_338;
  uv_handle_ptr_base_<uv_signal_s> local_328;
  uv_handle_ptr_base_<uv_handle_s> local_318 [46];
  
  iVar2 = uv_loop_init((uv_loop_t *)local_388);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not init loop",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return -1;
  }
  local_488 = (undefined1  [8])0x0;
  _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cm::uv_async_ptr::init((uv_async_ptr *)local_488,(EVP_PKEY_CTX *)local_388);
  local_498.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x10);
  (local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data =
       &PTR___State_005ed210;
  (local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loop =
       (uv_loop_t *)local_488;
  std::thread::_M_start_thread(&local_498,&local_408,0);
  if (local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (**(code **)((long)(local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->data + 8))();
  }
  std::thread::detach();
  if (local_498.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::terminate();
  }
  iVar2 = uv_run((uv_loop_t *)local_388,UV_RUN_DEFAULT);
  if (iVar2 != 0) {
    lVar6 = 0x23;
    pcVar9 = "Unclean exit state in testAsyncDtor";
LAB_00151975:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)local_488);
    return -1;
  }
  puVar3 = cm::uv_handle_ptr_base_<uv_async_s>::get((uv_handle_ptr_base_<uv_async_s> *)local_488);
  if (puVar3 != (uv_async_s *)0x0) {
    lVar6 = 0x2c;
    pcVar9 = "Loop exited with signal not being cleaned up";
    goto LAB_00151975;
  }
  cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_async_s> *)local_488);
  uv_loop_close((uv_loop_t *)local_388);
  iVar2 = uv_loop_init((uv_loop_t *)local_388);
  if (iVar2 == 0) {
    local_488 = (undefined1  [8])0x0;
    _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_async_ptr::init((uv_async_ptr *)local_488,(EVP_PKEY_CTX *)local_388);
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)local_488);
    uVar8 = 0;
    iVar2 = uv_run((uv_loop_t *)local_388,UV_RUN_DEFAULT);
    if (iVar2 != 0) {
      pcVar9 = "Unclean exit state in testAsyncDtor";
      lVar6 = 0x23;
      goto LAB_00151a66;
    }
    uv_loop_close((uv_loop_t *)local_388);
  }
  else {
    pcVar9 = "Could not init loop";
    lVar6 = 0x13;
LAB_00151a66:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    uVar8 = 0x80000000;
  }
  iVar2 = uv_loop_init((uv_loop_t *)local_388);
  if (iVar2 == 0) {
    local_488 = (undefined1  [8])0x0;
    _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_async_ptr::init((uv_async_ptr *)&local_408,(EVP_PKEY_CTX *)local_388);
    _Var1._M_pi = local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_488 = (undefined1  [8])
                local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this._M_pi = _Stack_480._M_pi;
    local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_480._M_pi = _Var1._M_pi;
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_(&local_408);
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)local_488);
    uVar7 = 0;
    iVar2 = uv_run((uv_loop_t *)local_388,UV_RUN_DEFAULT);
    if (iVar2 != 0) {
      pcVar9 = "Unclean exit state in testAsyncDtor";
      lVar6 = 0x23;
      goto LAB_00151b56;
    }
    uv_loop_close((uv_loop_t *)local_388);
  }
  else {
    pcVar9 = "Could not init loop";
    lVar6 = 0x13;
LAB_00151b56:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    uVar7 = 0x80000000;
  }
  iVar2 = uv_loop_init((uv_loop_t *)local_388);
  if (iVar2 == 0) {
    local_488 = (undefined1  [8])0x0;
    _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_pipe_ptr::init((uv_pipe_ptr *)local_488,(EVP_PKEY_CTX *)local_388);
    cm::uv_handle_ptr_base_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_pipe_ptr,void>
              ((uv_handle_ptr_base_<uv_stream_s> *)&local_408,(uv_pipe_ptr *)local_488);
    puVar4 = cm::uv_handle_ptr_base_<uv_pipe_s>::get((uv_handle_ptr_base_<uv_pipe_s> *)local_488);
    if (puVar4 == (uv_pipe_s *)0x0) {
      cm::uv_handle_ptr_base_<uv_handle_s>::
      uv_handle_ptr_base_<cm::uv_handle_ptr_<uv_stream_s>,void>
                (&local_498,(uv_handle_ptr_<uv_stream_s> *)&local_408);
      puVar5 = cm::uv_handle_ptr_base_<uv_stream_s>::get
                         ((uv_handle_ptr_base_<uv_stream_s> *)&local_408);
      if (puVar5 == (uv_stream_s *)0x0) {
        cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(&local_498);
        cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
                  ((uv_handle_ptr_base_<uv_stream_s> *)&local_408);
        cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                  ((uv_handle_ptr_base_<uv_pipe_s> *)local_488);
        uVar10 = 0;
        iVar2 = uv_run((uv_loop_t *)local_388,UV_RUN_DEFAULT);
        if (iVar2 == 0) {
          uv_loop_close((uv_loop_t *)local_388);
          goto LAB_00151d1f;
        }
        pcVar9 = "Unclean exit state in testCrossAssignment";
        lVar6 = 0x29;
        goto LAB_00151bae;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Move should be sure to invalidate the previous ptr",0x32);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(&local_498);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Move should be sure to invalidate the previous ptr",0x32);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_stream_s> *)&local_408);
    cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)local_488);
  }
  else {
    pcVar9 = "Could not init loop";
    lVar6 = 0x13;
LAB_00151bae:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  uVar10 = 0x80000000;
LAB_00151d1f:
  local_388._0_8_ = (element_type *)0x0;
  local_388._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_378.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_378.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_368.unused[1] = (void *)0x0;
  local_368.unused[0] = (void *)0x0;
  local_358.handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_358.handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_408.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3f8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_348.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_348.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3f8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3e8.handle.super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3e8.handle.super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3d8.handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3d8.handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3c8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_338.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_338.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3c8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3b8.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3b8.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3a8.handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3a8.handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_328.handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_328.handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_398.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_398.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318[0].handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318[0].handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_488 = (undefined1  [8])0x0;
  local_478.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_478.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_468.handle.super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_468.handle.super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_458.handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_458.handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_448.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_448.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_438.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_438.handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_428.handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_428.handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_418.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_418.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(&local_398);
  cm::uv_handle_ptr_base_<uv_signal_s>::~uv_handle_ptr_base_(&local_3a8);
  cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_(&local_3b8);
  cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_3c8);
  cm::uv_handle_ptr_base_<uv_process_s>::~uv_handle_ptr_base_(&local_3d8);
  cm::uv_handle_ptr_base_<uv_tty_s>::~uv_handle_ptr_base_(&local_3e8);
  cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_3f8);
  cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_stream_s> *)&local_408);
  cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(&local_418);
  cm::uv_handle_ptr_base_<uv_signal_s>::~uv_handle_ptr_base_(&local_428);
  cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_(&local_438);
  cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_448);
  cm::uv_handle_ptr_base_<uv_process_s>::~uv_handle_ptr_base_(&local_458);
  cm::uv_handle_ptr_base_<uv_tty_s>::~uv_handle_ptr_base_(&local_468);
  cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_478);
  cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_stream_s> *)local_488);
  cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(local_318);
  cm::uv_handle_ptr_base_<uv_signal_s>::~uv_handle_ptr_base_(&local_328);
  cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_(&local_338);
  cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_348);
  cm::uv_handle_ptr_base_<uv_process_s>::~uv_handle_ptr_base_(&local_358);
  cm::uv_handle_ptr_base_<uv_tty_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_tty_s> *)&local_368);
  cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_378);
  cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_stream_s> *)local_388);
  return (int)(uVar7 | uVar8 | uVar10) >> 0x1f;
}

Assistant:

int testUVRAII(int, char** const)
{
  if ((testAsyncShutdown() &&
       testAsyncDtor() & testAsyncMove() & testCrossAssignment() &
         testAllMoves()) == 0) {
    return -1;
  }
  return 0;
}